

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  SrcList *pSVar2;
  _func_void_Walker_ptr_Select_ptr *p_Var3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Parse *pPVar8;
  byte *pbVar9;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar5 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar5 != 0) {
        return uVar5 & 2;
      }
      iVar6 = sqlite3WalkExprList(pWalker,p->pEList);
      iVar7 = 2;
      if (iVar6 == 0) {
        if (p->pWhere != (Expr *)0x0) {
          iVar6 = sqlite3WalkExprNN(pWalker,p->pWhere);
          iVar7 = 2;
          if (iVar6 != 0) goto LAB_0017c759;
        }
        iVar6 = sqlite3WalkExprList(pWalker,p->pGroupBy);
        iVar7 = 2;
        if (iVar6 == 0) {
          if (p->pHaving != (Expr *)0x0) {
            iVar6 = sqlite3WalkExprNN(pWalker,p->pHaving);
            iVar7 = 2;
            if (iVar6 != 0) goto LAB_0017c759;
          }
          iVar6 = sqlite3WalkExprList(pWalker,p->pOrderBy);
          iVar7 = 2;
          if (iVar6 == 0) {
            if (p->pLimit != (Expr *)0x0) {
              iVar6 = sqlite3WalkExprNN(pWalker,p->pLimit);
              iVar7 = 2;
              if (iVar6 != 0) goto LAB_0017c759;
            }
            if (p->pWinDefn != (Window *)0x0) {
              p_Var3 = pWalker->xSelectCallback2;
              if (p_Var3 == sqlite3WalkWinDefnDummyCallback) {
LAB_0017c8a9:
                bVar4 = false;
                uVar5 = walkWindowList(pWalker,p->pWinDefn,0);
                pPVar8 = (Parse *)(ulong)uVar5;
              }
              else {
                pPVar8 = pWalker->pParse;
                if (pPVar8 == (Parse *)0x0) {
                  bVar4 = true;
                  if (p_Var3 == sqlite3SelectPopWith) goto LAB_0017c8a9;
                }
                else if ((p_Var3 == sqlite3SelectPopWith) || (bVar4 = true, 1 < pPVar8->eParseMode))
                goto LAB_0017c8a9;
              }
              iVar7 = (int)pPVar8;
              if (!bVar4) goto LAB_0017c759;
            }
            iVar7 = 0;
          }
        }
      }
LAB_0017c759:
      if (iVar7 != 0) {
        return 2;
      }
      pSVar2 = p->pSrc;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        pbVar9 = &pSVar2->a[0].fg.field_0x1;
        iVar6 = pSVar2->nSrc + 1;
        do {
          if (((*pbVar9 & 4) != 0) &&
             (iVar7 = sqlite3WalkSelect(pWalker,(Select *)**(undefined8 **)(pbVar9 + 0x27)),
             iVar7 != 0)) {
            return 2;
          }
          if (((*pbVar9 & 8) != 0) &&
             (iVar7 = sqlite3WalkExprList(pWalker,*(ExprList **)(pbVar9 + 0xf)), iVar7 != 0)) {
            return 2;
          }
          pbVar9 = pbVar9 + 0x48;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}